

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O2

void deqp::gls::genCompareOp
               (ostringstream *output,char *dstVec4Var,ValueBlock *valueBlock,
               char *nonFloatNamePrefix,char *checkVarName)

{
  pointer pVVar1;
  bool bVar2;
  DataType DVar3;
  ostream *poVar4;
  string *psVar5;
  long lVar6;
  char *pcVar7;
  size_t ndx;
  ulong uVar8;
  
  bVar2 = true;
  lVar6 = 0x18;
  for (uVar8 = 0;
      pVVar1 = (valueBlock->outputs).
               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar8 < (ulong)(((long)(valueBlock->outputs).
                             super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x50);
      uVar8 = uVar8 + 1) {
    pcVar7 = "RES = RES && ";
    if (bVar2) {
      pcVar7 = "bool RES = ";
      bVar2 = false;
    }
    std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,pcVar7);
    DVar3 = glu::getDataTypeScalarType(*(DataType *)((long)pVVar1 + lVar6 + -0x10));
    poVar4 = std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,"isOk(");
    if (DVar3 == TYPE_FLOAT) {
      pcVar7 = ", 0.05);\n";
    }
    else {
      poVar4 = std::operator<<(poVar4,nonFloatNamePrefix);
      pcVar7 = ");\n";
    }
    psVar5 = (string *)((long)&(pVVar1->type).m_type + lVar6);
    poVar4 = std::operator<<(poVar4,psVar5);
    poVar4 = std::operator<<(poVar4,", ref_");
    poVar4 = std::operator<<(poVar4,psVar5);
    std::operator<<(poVar4,pcVar7);
    lVar6 = lVar6 + 0x50;
  }
  poVar4 = std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,dstVec4Var);
  pcVar7 = " = vec4(RES, RES, RES, 1.0);\n";
  if (bVar2) {
    pcVar7 = " = vec4(1.0);\n";
  }
  std::operator<<(poVar4,pcVar7);
  return;
}

Assistant:

static void genCompareOp (ostringstream& output, const char* dstVec4Var, const ValueBlock& valueBlock, const char* nonFloatNamePrefix, const char* checkVarName)
{
	bool isFirstOutput = true;

	for (size_t ndx = 0; ndx < valueBlock.outputs.size(); ndx++)
	{
		const Value&	val		= valueBlock.outputs[ndx];

		// Check if we're only interested in one variable (then skip if not the right one).
		if (checkVarName && val.name != checkVarName)
			continue;

		// Prefix.
		if (isFirstOutput)
		{
			output << "bool RES = ";
			isFirstOutput = false;
		}
		else
			output << "RES = RES && ";

		// Generate actual comparison.
		if (getDataTypeScalarType(val.type.getBasicType()) == TYPE_FLOAT)
			output << "isOk(" << val.name << ", ref_" << val.name << ", 0.05);\n";
		else
			output << "isOk(" << nonFloatNamePrefix << val.name << ", ref_" << val.name << ");\n";
	}

	if (isFirstOutput)
		output << dstVec4Var << " = vec4(1.0);\n";	// \todo [petri] Should we give warning if not expect-failure case?
	else
		output << dstVec4Var << " = vec4(RES, RES, RES, 1.0);\n";
}